

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeThumb2BCCInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  void *Decoder_00;
  uint64_t Address_00;
  
  if ((~Insn & 0x3800000) == 0) {
    uVar2 = (Insn >> 4) + 0xf0c4070c;
    DVar1 = MCDisassembler_Fail;
    if (uVar2 < 3) {
      MCInst_setOpcode(Inst,*(uint *)(&DAT_002fb438 + (ulong)uVar2 * 4));
      MCOperand_CreateImm0(Inst,(ulong)(Insn & 0xf));
      DVar1 = MCDisassembler_Success;
    }
  }
  else {
    uVar2 = (Insn & 0x800) * 0x100;
    Decoder_00 = (void *)(ulong)uVar2;
    MCOperand_CreateImm0
              (Inst,(long)((ulong)(uVar2 + (Insn & 0x7ff) * 2 | (Insn & 0x2000) << 5 |
                                   Insn >> 4 & 0x3f000 | Insn >> 6 & 0x100000) << 0x2b) >> 0x2b);
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x16 & 0xf,Address_00,Decoder_00);
    DVar1 = *(DecodeStatus *)(&DAT_002fb4d0 + (ulong)DVar1 * 4);
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeThumb2BCCInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned brtarget;
	unsigned pred = fieldFromInstruction_4(Insn, 22, 4);
	if (pred == 0xE || pred == 0xF) {
		unsigned imm;
		unsigned opc = fieldFromInstruction_4(Insn, 4, 28);
		switch (opc) {
			default:
				return MCDisassembler_Fail;
			case 0xf3bf8f4:
				MCInst_setOpcode(Inst, ARM_t2DSB);
				break;
			case 0xf3bf8f5:
				MCInst_setOpcode(Inst, ARM_t2DMB);
				break;
			case 0xf3bf8f6:
				MCInst_setOpcode(Inst, ARM_t2ISB);
				break;
		}

		imm = fieldFromInstruction_4(Insn, 0, 4);
		return DecodeMemBarrierOption(Inst, imm, Address, Decoder);
	}

	brtarget = fieldFromInstruction_4(Insn, 0, 11) << 1;
	brtarget |= fieldFromInstruction_4(Insn, 11, 1) << 19;
	brtarget |= fieldFromInstruction_4(Insn, 13, 1) << 18;
	brtarget |= fieldFromInstruction_4(Insn, 16, 6) << 12;
	brtarget |= fieldFromInstruction_4(Insn, 26, 1) << 20;

	if (!Check(&S, DecodeT2BROperand(Inst, brtarget, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}